

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall kratos::VarCasted::set_target_width(VarCasted *this,uint32_t width)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  size_type sVar2;
  reference pvVar3;
  UserException *this_00;
  allocator<char> local_39;
  string local_38;
  uint32_t local_14;
  VarCasted *pVStack_10;
  uint32_t width_local;
  VarCasted *this_local;
  
  local_14 = width;
  pVStack_10 = this;
  pvVar1 = Var::size(this->parent_var_);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar1);
  if (1 < sVar2) {
    pvVar1 = Var::size(this->parent_var_);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(pvVar1);
    if (*pvVar3 != 1) {
      this_00 = (UserException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Width casting for array not supported",&local_39);
      UserException::UserException(this_00,&local_38);
      __cxa_throw(this_00,&UserException::typeinfo,UserException::~UserException);
    }
  }
  if (this->cast_type_ == Resize) {
    this->target_width_ = local_14;
    (this->super_Var).var_width_ = local_14;
  }
  return;
}

Assistant:

void VarCasted::set_target_width(uint32_t width) {
    // override the current width
    if (parent_var_->size().size() > 1 && parent_var_->size().front() != 1) {
        throw UserException("Width casting for array not supported");
    }
    if (cast_type_ == VarCastType::Resize) {
        target_width_ = width;
        var_width_ = width;
    }
}